

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O0

int lyxml_print_mem(char **strp,lyxml_elem *elem,int options)

{
  int local_4c;
  undefined1 local_48 [4];
  int r;
  lyout out;
  int options_local;
  lyxml_elem *elem_local;
  char **strp_local;
  
  if ((strp == (char **)0x0) || (elem == (lyxml_elem *)0x0)) {
    strp_local._4_4_ = 0;
  }
  else {
    local_48 = (undefined1  [4])0x2;
    out.type = LYOUT_FD;
    out._4_4_ = 0;
    out.method.f = (FILE *)0x0;
    out.method.mem.len = 0;
    out.method.mem.size._4_4_ = options;
    if ((options & 0x10U) == 0) {
      local_4c = dump_elem((lyout *)local_48,elem,0,options,1);
    }
    else {
      local_4c = dump_siblings((lyout *)local_48,elem,options);
    }
    *strp = (char *)out._0_8_;
    strp_local._4_4_ = local_4c;
  }
  return strp_local._4_4_;
}

Assistant:

API int
lyxml_print_mem(char **strp, const struct lyxml_elem *elem, int options)
{
    struct lyout out;
    int r;

    if (!strp || !elem) {
        return 0;
    }

    out.type = LYOUT_MEMORY;
    out.method.mem.buf = NULL;
    out.method.mem.len = 0;
    out.method.mem.size = 0;

    if (options & LYXML_PRINT_SIBLINGS) {
        r = dump_siblings(&out, elem, options);
    } else {
        r = dump_elem(&out, elem, 0, options, 1);
    }

    *strp = out.method.mem.buf;
    return r;
}